

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_store_in_memory.cc
# Opt level: O0

void __thiscall
bssl::TrustStoreInMemory::AddCertificate
          (TrustStoreInMemory *this,shared_ptr<const_bssl::ParsedCertificate> *cert,
          CertificateTrust *trust)

{
  element_type *this_00;
  size_t extraout_RDX;
  Span<const_unsigned_char> b;
  Span<const_unsigned_char> local_68;
  bssl *local_58;
  uchar *local_50;
  string_view local_48;
  undefined1 local_38 [8];
  Entry entry;
  CertificateTrust *trust_local;
  shared_ptr<const_bssl::ParsedCertificate> *cert_local;
  TrustStoreInMemory *this_local;
  
  entry.trust = (CertificateTrust)trust;
  Entry::Entry((Entry *)local_38);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::operator=
            ((shared_ptr<const_bssl::ParsedCertificate> *)local_38,cert);
  entry.cert.super___shared_ptr<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)entry.trust;
  this_00 = ::std::
            __shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_bssl::ParsedCertificate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_38);
  local_68 = (Span<const_unsigned_char>)ParsedCertificate::normalized_subject(this_00);
  Span<unsigned_char_const>::Span<bssl::der::Input,void,bssl::der::Input>
            ((Span<unsigned_char_const> *)&local_58,(Input *)&local_68);
  b.size_ = extraout_RDX;
  b.data_ = local_50;
  local_48 = BytesAsStringView(local_58,b);
  ::std::
  unordered_multimap<std::basic_string_view<char,std::char_traits<char>>,bssl::TrustStoreInMemory::Entry,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,bssl::TrustStoreInMemory::Entry>>>
  ::emplace<std::basic_string_view<char,std::char_traits<char>>,bssl::TrustStoreInMemory::Entry&>
            ((unordered_multimap<std::basic_string_view<char,std::char_traits<char>>,bssl::TrustStoreInMemory::Entry,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,bssl::TrustStoreInMemory::Entry>>>
              *)&this->entries_,&local_48,(Entry *)local_38);
  Entry::~Entry((Entry *)local_38);
  return;
}

Assistant:

void TrustStoreInMemory::AddCertificate(
    std::shared_ptr<const ParsedCertificate> cert,
    const CertificateTrust &trust) {
  Entry entry;
  entry.cert = std::move(cert);
  entry.trust = trust;

  // TODO(mattm): should this check for duplicate certificates?
  entries_.emplace(BytesAsStringView(entry.cert->normalized_subject()), entry);
}